

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVisualSceneLoader.cpp
# Opt level: O0

UniqueId * __thiscall COLLADASaxFWL::VisualSceneLoader::getUniqueId(VisualSceneLoader *this)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  undefined4 extraout_var;
  long in_RDI;
  Node *currentNode;
  UniqueId *local_8;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    if (*(long *)(in_RDI + 0x80) == 0) {
      bVar1 = std::
              stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
              ::empty((stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                       *)0xb36d85);
      if (bVar1) {
        if (*(long *)(in_RDI + 0x120) == 0) {
          local_8 = (UniqueId *)&COLLADAFW::UniqueId::INVALID;
        }
        else {
          local_8 = (UniqueId *)(**(code **)(**(long **)(in_RDI + 0x120) + 0x18))();
        }
      }
      else {
        ppNVar3 = std::
                  stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                  ::top((stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                         *)0xb36d9b);
        iVar2 = (*((*ppNVar3)->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)424>).
                  super_Object._vptr_Object[3])();
        local_8 = (UniqueId *)CONCAT44(extraout_var,iVar2);
      }
    }
    else {
      local_8 = (UniqueId *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x18))();
    }
  }
  else {
    local_8 = (UniqueId *)(**(code **)(**(long **)(in_RDI + 0x88) + 0x18))();
  }
  return local_8;
}

Assistant:

const COLLADAFW::UniqueId& VisualSceneLoader::getUniqueId()
    {
        if ( mCurrentInstanceController )
		{
			return mCurrentInstanceController->getUniqueId();
		}
        else if ( mCurrentInstanceGeometry )
		{
			return mCurrentInstanceGeometry->getUniqueId();
		}

		if ( !mNodeStack.empty() )
		{
			COLLADAFW::Node* currentNode = mNodeStack.top();
			return currentNode->getUniqueId();
		}

        if ( mVisualScene )
		{
			return mVisualScene->getUniqueId();
		}

        return COLLADAFW::UniqueId::INVALID;
    }